

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxClassTypeCast::Resolve(FxClassTypeCast *this,FCompileContext *ctx)

{
  PPointer *pPVar1;
  PClass *pPVar2;
  PType *this_00;
  PClass *pPVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  FxNameCast *this_01;
  PClass *pPVar6;
  FxClassTypeCast *pFVar7;
  PClass *pPVar8;
  char *message;
  FScriptPosition *other;
  char *pcVar9;
  FName clsname;
  undefined1 local_3c [12];
  FString local_30;
  FName local_24;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  if (this->basex != (FxExpression *)0x0) {
    iVar4 = (*this->basex->_vptr_FxExpression[2])();
    this->basex = (FxExpression *)CONCAT44(extraout_var,iVar4);
  }
  pFVar7 = (FxClassTypeCast *)this->basex;
  if (pFVar7 == (FxClassTypeCast *)0x0) {
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    return &((FxClassTypeCast *)0x0)->super_FxExpression;
  }
  pPVar1 = (PPointer *)(pFVar7->super_FxExpression).ValueType;
  pPVar2 = (PClass *)(this->super_FxExpression).ValueType;
  if (pPVar1 != TypeNullPtr) {
    if ((pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject.Class == (PClass *)0x0)
    {
      iVar4 = (**(pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject._vptr_DObject)
                        (pPVar1);
      (pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject.Class =
           (PClass *)CONCAT44(extraout_var_00,iVar4);
    }
    pFVar7 = (FxClassTypeCast *)this->basex;
    this_00 = (pFVar7->super_FxExpression).ValueType;
    if ((pPVar1->super_PBasicType).super_PType.super_PTypeBase.super_DObject.Class !=
        PClassPointer::RegistrationInfo.MyClass) {
      if ((this_00 != (PType *)TypeName) && (this_00 != (PType *)TypeString)) {
        pcVar5 = PType::DescriptiveName(this_00);
        pFVar7 = (FxClassTypeCast *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,"Cannot convert %s to class type",
                   pcVar5);
        goto LAB_0053ba65;
      }
      iVar4 = (*(pFVar7->super_FxExpression)._vptr_FxExpression[3])(pFVar7);
      if ((char)iVar4 == '\0') {
        if (this->basex->ValueType != (PType *)TypeString) {
          return &this->super_FxExpression;
        }
        this_01 = (FxNameCast *)FMemArena::Alloc(&FxAlloc,0x30);
        FxNameCast::FxNameCast(this_01,this->basex);
        this->basex = (FxExpression *)this_01;
        return &this->super_FxExpression;
      }
      local_3c._4_8_ = this->basex[1]._vptr_FxExpression;
      other = &this->basex[1].ScriptPosition;
      if ((PString *)local_3c._4_8_ == TypeString) {
        FString::AttachToOther(&local_30,&other->FileName);
      }
      else {
        local_30.Chars = (other->FileName).Chars;
      }
      ExpVal::GetName((ExpVal *)local_3c);
      if ((PString *)local_3c._4_8_ == TypeString) {
        FString::~FString(&local_30);
      }
      if (local_3c._0_4_ == 0) {
        pPVar6 = (PClass *)0x0;
      }
      else {
        local_24.Index = local_3c._0_4_;
        pPVar6 = PClass::FindClass(&local_24);
        if (pPVar6 == (PClass *)0x0) {
          pcVar5 = FName::NameData.NameArray[(int)local_3c._0_4_].Text;
          pcVar9 = FName::NameData.NameArray
                   [(this->desttype->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.
                    Index].Text;
          message = "Unknown class name \'%s\' of type \'%s\'";
LAB_0053bc3e:
          pPVar6 = (PClass *)0x0;
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,3,message,pcVar5,pcVar9);
        }
        else {
          pPVar3 = this->desttype;
          pPVar8 = pPVar6;
          if (pPVar6 != pPVar3) {
            do {
              pPVar8 = pPVar8->ParentClass;
              if (pPVar8 == pPVar3) break;
            } while (pPVar8 != (PClass *)0x0);
            if (pPVar8 == (PClass *)0x0) {
              pcVar5 = FName::NameData.NameArray[(int)local_3c._0_4_].Text;
              pcVar9 = FName::NameData.NameArray
                       [(pPVar3->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName.Index]
                       .Text;
              message = "class \'%s\' is not compatible with \'%s\'";
              goto LAB_0053bc3e;
            }
          }
          FScriptPosition::Message
                    (&(this->super_FxExpression).ScriptPosition,8,"resolving \'%s\' as class name",
                     FName::NameData.NameArray[(int)local_3c._0_4_].Text);
        }
      }
      pFVar7 = (FxClassTypeCast *)FMemArena::Alloc(&FxAlloc,0x38);
      (pFVar7->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(pFVar7->super_FxExpression).ScriptPosition,
                 &(this->super_FxExpression).ScriptPosition);
      (pFVar7->super_FxExpression).ExprType = EFX_Constant;
      (pFVar7->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxConstant_007113e8;
      pFVar7->basex = (FxExpression *)pPVar6;
      (pFVar7->super_FxExpression).ValueType = (PType *)pPVar2;
      pFVar7->desttype = pPVar2;
      (pFVar7->super_FxExpression).isresolved = true;
      (pFVar7->super_FxExpression).NeedResult = true;
      goto LAB_0053ba65;
    }
    pPVar6 = (PClass *)this_00[1].super_PTypeBase.super_DObject.ObjNext;
    pPVar3 = (PClass *)(pPVar2->super_PNativeStruct).super_PStruct.Fields.Array;
    pPVar8 = pPVar6;
    if (pPVar6 != pPVar3) {
      do {
        pPVar8 = (PClass *)
                 ((TArray<std::pair<const_PType_*,_unsigned_int>,_std::pair<const_PType_*,_unsigned_int>_>
                   *)&pPVar8->ParentClass)->Array;
        if (pPVar8 == pPVar3) break;
      } while (pPVar8 != (PClass *)0x0);
      if (pPVar8 == (PClass *)0x0) {
        pFVar7 = (FxClassTypeCast *)0x0;
        FScriptPosition::Message
                  (&(this->super_FxExpression).ScriptPosition,2,
                   "Cannot convert from %s to %s: Incompatible class types",
                   FName::NameData.NameArray
                   [*(int *)&((DObject *)
                             &(pPVar6->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName)
                             ->_vptr_DObject].Text,
                   FName::NameData.NameArray
                   [*(int *)&((DObject *)
                             &(pPVar3->super_PNativeStruct).super_PStruct.super_PNamedType.TypeName)
                             ->_vptr_DObject].Text);
        goto LAB_0053ba65;
      }
    }
  }
  (pFVar7->super_FxExpression).ValueType = (PType *)pPVar2;
  this->basex = (FxExpression *)0x0;
LAB_0053ba65:
  (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
  return &pFVar7->super_FxExpression;
}

Assistant:

FxExpression *FxClassTypeCast::Resolve(FCompileContext &ctx)
{
	CHECKRESOLVED();
	SAFE_RESOLVE(basex, ctx);

	if (basex->ValueType == TypeNullPtr)
	{
		basex->ValueType = ValueType;
		auto x = basex;
		basex = nullptr;
		delete this;
		return x;
	}
	auto to = static_cast<PClassPointer *>(ValueType);
	if (basex->ValueType->GetClass() == RUNTIME_CLASS(PClassPointer))
	{
		auto from = static_cast<PClassPointer *>(basex->ValueType);
		if (from->ClassRestriction->IsDescendantOf(to->ClassRestriction))
		{
			basex->ValueType = to;
			auto x = basex;
			basex = nullptr;
			delete this;
			return x;
		}
		ScriptPosition.Message(MSG_ERROR, "Cannot convert from %s to %s: Incompatible class types", from->ClassRestriction->TypeName.GetChars(), to->ClassRestriction->TypeName.GetChars());
		delete this;
		return nullptr;
	}
	
	if (basex->ValueType != TypeName && basex->ValueType != TypeString)
	{
		ScriptPosition.Message(MSG_ERROR, "Cannot convert %s to class type", basex->ValueType->DescriptiveName());
		delete this;
		return nullptr;
	}

	if (basex->isConstant())
	{
		FName clsname = static_cast<FxConstant *>(basex)->GetValue().GetName();
		PClass *cls = nullptr;

		if (clsname != NAME_None)
		{
			cls = PClass::FindClass(clsname);
			if (cls == nullptr)
			{
				/* lax */
				// Since this happens in released WADs it must pass without a terminal error... :(
				ScriptPosition.Message(MSG_OPTERROR,
					"Unknown class name '%s' of type '%s'",
					clsname.GetChars(), desttype->TypeName.GetChars());
			}
			else
			{
				if (!cls->IsDescendantOf(desttype))
				{
					ScriptPosition.Message(MSG_OPTERROR, "class '%s' is not compatible with '%s'", clsname.GetChars(), desttype->TypeName.GetChars());
					cls = nullptr;
				}
				else ScriptPosition.Message(MSG_DEBUGLOG, "resolving '%s' as class name", clsname.GetChars());
			}
		}
		FxExpression *x = new FxConstant(cls, to, ScriptPosition);
		delete this;
		return x;
	}
	if (basex->ValueType == TypeString)
	{
		basex = new FxNameCast(basex);
	}
	return this;
}